

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_string.h
# Opt level: O2

int JetHead::split<std::__cxx11::string>
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
              char *split_chars,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *parts)

{
  int iVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = std::__cxx11::string::find_first_of((char *)str,(ulong)split_chars);
  do {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(parts,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    iVar2 = iVar1;
    do {
      iVar2 = iVar2 + 1;
      iVar1 = std::__cxx11::string::find_first_of((char *)str,(ulong)split_chars);
    } while (iVar2 == iVar1);
  } while( true );
}

Assistant:

int	split( const _string &str, const char *split_chars, JetHead::vector<_string> &parts )
	{
		unsigned pos = str.find_first_of( split_chars );
		unsigned start = 0;
		
		while ( pos != _string::npos )
		{
			parts.push_back( str.substr( start, pos - start ) );
			
			start = pos + 1;
			pos = str.find_first_of( split_chars, start );
			
			// if next char is also in split_chars, then search until we find a 
			//  char that is not.
			while( pos == start )
			{
				start = pos + 1;
				pos = str.find_first_of( split_chars, start );
			}
		}
		
		parts.push_back( str.substr( start, pos - start ) );
		
		return parts.size();
	}